

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_groestl.c
# Opt level: O1

void Transform(groestlHashState *ctx,uint8_t *input,int msglen)

{
  uint32_t *puVar1;
  uint *puVar2;
  uint32_t *puVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint32_t Ptmp [16];
  uint32_t Qtmp [16];
  uint32_t y [16];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  uint32_t local_f8;
  uint auStack_f4 [15];
  uint32_t local_b8;
  uint auStack_b4 [15];
  uint32_t local_78 [18];
  
  if (0x3f < msglen) {
    do {
      local_138 = *(undefined8 *)input;
      uStack_130 = *(undefined8 *)(input + 8);
      local_128 = *(undefined8 *)(input + 0x10);
      uStack_120 = *(undefined8 *)(input + 0x18);
      local_118 = *(undefined8 *)(input + 0x20);
      uStack_110 = *(undefined8 *)(input + 0x28);
      local_108 = *(undefined8 *)(input + 0x30);
      uStack_100 = *(undefined8 *)(input + 0x38);
      lVar14 = 0;
      do {
        puVar2 = (uint *)(input + lVar14 * 4);
        uVar5 = puVar2[1];
        uVar6 = puVar2[2];
        uVar7 = puVar2[3];
        puVar1 = ctx->chaining + lVar14;
        uVar8 = puVar1[1];
        uVar9 = puVar1[2];
        uVar10 = puVar1[3];
        (&local_f8)[lVar14] = *puVar1 ^ *puVar2;
        auStack_f4[lVar14] = uVar8 ^ uVar5;
        auStack_f4[lVar14 + 1] = uVar9 ^ uVar6;
        auStack_f4[lVar14 + 2] = uVar10 ^ uVar7;
        lVar14 = lVar14 + 4;
      } while (lVar14 != 0x10);
      RND512Q((uint8_t *)&local_138,local_78,0);
      RND512Q((uint8_t *)local_78,(uint32_t *)&local_138,0x1000000);
      RND512Q((uint8_t *)&local_138,local_78,0x2000000);
      RND512Q((uint8_t *)local_78,(uint32_t *)&local_138,0x3000000);
      RND512Q((uint8_t *)&local_138,local_78,0x4000000);
      RND512Q((uint8_t *)local_78,(uint32_t *)&local_138,0x5000000);
      RND512Q((uint8_t *)&local_138,local_78,0x6000000);
      RND512Q((uint8_t *)local_78,(uint32_t *)&local_138,0x7000000);
      RND512Q((uint8_t *)&local_138,local_78,0x8000000);
      RND512Q((uint8_t *)local_78,&local_b8,0x9000000);
      RND512P((uint8_t *)&local_f8,local_78,0);
      RND512P((uint8_t *)local_78,(uint32_t *)&local_138,1);
      RND512P((uint8_t *)&local_138,local_78,2);
      RND512P((uint8_t *)local_78,(uint32_t *)&local_138,3);
      RND512P((uint8_t *)&local_138,local_78,4);
      RND512P((uint8_t *)local_78,(uint32_t *)&local_138,5);
      RND512P((uint8_t *)&local_138,local_78,6);
      RND512P((uint8_t *)local_78,(uint32_t *)&local_138,7);
      RND512P((uint8_t *)&local_138,local_78,8);
      RND512P((uint8_t *)local_78,&local_f8,9);
      lVar14 = 0;
      do {
        uVar5 = auStack_b4[lVar14];
        uVar6 = auStack_b4[lVar14 + 1];
        uVar7 = auStack_b4[lVar14 + 2];
        uVar8 = auStack_f4[lVar14];
        uVar9 = auStack_f4[lVar14 + 1];
        uVar10 = auStack_f4[lVar14 + 2];
        puVar1 = ctx->chaining + lVar14;
        uVar11 = puVar1[1];
        uVar12 = puVar1[2];
        uVar13 = puVar1[3];
        puVar3 = ctx->chaining + lVar14;
        *puVar3 = *puVar1 ^ (&local_b8)[lVar14] ^ (&local_f8)[lVar14];
        puVar3[1] = uVar11 ^ uVar5 ^ uVar8;
        puVar3[2] = uVar12 ^ uVar6 ^ uVar9;
        puVar3[3] = uVar13 ^ uVar7 ^ uVar10;
        lVar14 = lVar14 + 4;
      } while (lVar14 != 0x10);
      puVar1 = &ctx->block_counter1;
      *puVar1 = *puVar1 + 1;
      if (*puVar1 == 0) {
        ctx->block_counter2 = ctx->block_counter2 + 1;
      }
      input = input + 0x40;
      bVar4 = 0x7f < msglen;
      msglen = msglen + -0x40;
    } while (bVar4);
  }
  return;
}

Assistant:

static void Transform(groestlHashState *ctx,
	       const uint8_t *input, 
	       int msglen) {

  /* digest message, one block at a time */
  for (; msglen >= SIZE512; 
       msglen -= SIZE512, input += SIZE512) {
    F512(ctx->chaining,(uint32_t*)input);

    /* increment block counter */
    ctx->block_counter1++;
    if (ctx->block_counter1 == 0) ctx->block_counter2++;
  }
}